

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_decompressBlock_internal
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,int frame)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  size_t sVar9;
  ulong uVar10;
  undefined8 uVar11;
  seq_t sequence;
  seq_t sequence_00;
  ZSTD_DCtx *pZVar12;
  U32 i;
  uint uVar13;
  size_t sVar14;
  size_t sVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  byte bVar19;
  byte bVar20;
  BYTE *oend;
  ulong uVar21;
  BYTE *pBVar22;
  BYTE *pBVar23;
  BYTE *pBVar24;
  BYTE *pBVar25;
  int iVar26;
  size_t sVar27;
  BYTE *pBVar28;
  uint uVar29;
  ulong *puVar30;
  ulong uVar31;
  ulong uVar32;
  BYTE *pBVar33;
  size_t srcSize_00;
  ulong uVar34;
  BYTE *pBVar35;
  BYTE *pBVar36;
  BYTE *pBVar37;
  BYTE *litPtr;
  int nbSeq;
  seq_t sequences [4];
  ZSTD_longOffset_e in_stack_fffffffffffffde8;
  ulong local_1c0;
  ulong local_1a8;
  BYTE *local_1a0;
  uint local_194;
  BYTE *local_190;
  BIT_DStream_t local_188;
  ZSTD_fseState local_160;
  ZSTD_fseState local_150;
  ZSTD_fseState local_140;
  ulong local_130 [3];
  BYTE *local_118 [2];
  long local_108;
  BYTE *local_100;
  BYTE *local_f8;
  ZSTD_DCtx *local_f0;
  BYTE *local_e8;
  BYTE *local_e0;
  ulong local_d8;
  size_t sStack_d0;
  ulong uStack_c8;
  BYTE *pBStack_c0;
  ulong local_b8;
  size_t local_b0;
  ulong local_a8 [15];
  
  if (0x1ffff < srcSize) {
    return 0xffffffffffffffb8;
  }
  local_f0 = dctx;
  sVar14 = ZSTD_decodeLiteralsBlock(dctx,src,srcSize);
  if (0xffffffffffffff88 < sVar14) {
    return sVar14;
  }
  srcSize_00 = srcSize - sVar14;
  iVar26 = local_f0->ddictIsCold;
  local_f8 = (BYTE *)dst;
  sVar15 = ZSTD_decodeSeqHeaders(local_f0,(int *)&local_194,(void *)((long)src + sVar14),srcSize_00)
  ;
  pBVar28 = local_f8;
  if (0xffffffffffffff88 < sVar15) {
    return sVar15;
  }
  puVar30 = (ulong *)((long)((long)src + sVar14) + sVar15);
  sVar14 = srcSize_00 - sVar15;
  if (iVar26 == 0) {
    if (frame == 0) {
      if ((int)local_194 < 5) goto LAB_00163591;
    }
    else if ((local_f0->fParams).windowSize < 0x1000001 || (int)local_194 < 5) {
LAB_00163591:
      local_f0->ddictIsCold = 0;
      goto LAB_0016359c;
    }
    uVar13 = ZSTD_getLongOffsetsShare(local_f0->OFTptr);
    local_f0->ddictIsCold = 0;
    if (uVar13 < 7) {
LAB_0016359c:
      sVar14 = ZSTD_decompressSequences
                         (local_f0,pBVar28,dstCapacity,puVar30,sVar14,local_194,
                          in_stack_fffffffffffffde8);
      return sVar14;
    }
  }
  else {
    local_f0->ddictIsCold = 0;
  }
  pZVar12 = local_f0;
  if (local_f0->bmi2 != 0) {
    sVar14 = ZSTD_decompressSequencesLong_bmi2
                       (local_f0,pBVar28,dstCapacity,puVar30,sVar14,local_194,
                        in_stack_fffffffffffffde8);
    return sVar14;
  }
  oend = pBVar28 + dstCapacity;
  local_1a0 = local_f0->litPtr;
  sVar9 = local_f0->litSize;
  pBVar25 = local_1a0 + sVar9;
  pBVar22 = pBVar28;
  if (local_194 == 0) {
LAB_00164679:
    sVar27 = (long)pBVar25 - (long)local_1a0;
    if (sVar27 <= (ulong)((long)oend - (long)pBVar28)) {
      memcpy(pBVar28,local_1a0,sVar27);
      return (size_t)(pBVar28 + (sVar27 - (long)pBVar22));
    }
    return 0xffffffffffffffba;
  }
  pBVar25 = (BYTE *)local_f0->prefixStart;
  local_e0 = (BYTE *)local_f0->virtualStart;
  local_118[1] = (BYTE *)local_f0->dictEnd;
  local_f0->fseEntropy = 1;
  lVar16 = -0xc;
  do {
    *(ulong *)((long)local_118 + lVar16 * 2) = (ulong)*(uint *)((long)local_f0->workspace + lVar16);
    lVar16 = lVar16 + 4;
  } while (lVar16 != 0);
  uVar13 = 4;
  if ((int)local_194 < 4) {
    uVar13 = local_194;
  }
  local_108 = (long)pBVar28 - (long)pBVar25;
  local_118[0] = pBVar25;
  if ((long)sVar14 < 0) {
    __assert_fail("iend >= ip",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x6501,
                  "size_t ZSTD_decompressSequencesLong_body(ZSTD_DCtx *, void *, size_t, const void *, size_t, int, const ZSTD_longOffset_e)"
                 );
  }
  if (srcSize_00 == sVar15) {
    return 0xffffffffffffffec;
  }
  local_188.limitPtr = (char *)(puVar30 + 1);
  if (sVar14 < 8) {
    local_188.bitContainer = (size_t)(byte)*puVar30;
    switch(sVar14) {
    case 7:
      local_188.bitContainer = local_188.bitContainer | (ulong)*(byte *)((long)puVar30 + 6) << 0x30;
    case 6:
      local_188.bitContainer =
           local_188.bitContainer + ((ulong)*(byte *)((long)puVar30 + 5) << 0x28);
    case 5:
      local_188.bitContainer =
           local_188.bitContainer + ((ulong)*(byte *)((long)puVar30 + 4) << 0x20);
    case 4:
      local_188.bitContainer =
           local_188.bitContainer + (ulong)*(byte *)((long)puVar30 + 3) * 0x1000000;
    case 3:
      local_188.bitContainer =
           local_188.bitContainer + (ulong)*(byte *)((long)puVar30 + 2) * 0x10000;
    case 2:
      local_188.bitContainer = (ulong)*(byte *)((long)puVar30 + 1) * 0x100 + local_188.bitContainer;
    }
    bVar1 = *(byte *)((long)src + (srcSize - 1));
    if (bVar1 == 0) {
      return 0xffffffffffffffec;
    }
    uVar29 = 0x1f;
    if (bVar1 != 0) {
      for (; bVar1 >> uVar29 == 0; uVar29 = uVar29 - 1) {
      }
    }
    local_188.bitsConsumed = (uVar29 ^ 0x1f) + (int)sVar14 * -8 + 0x29;
    local_188.ptr = (char *)puVar30;
  }
  else {
    local_188.ptr = (char *)((long)src + (srcSize - 8));
    local_188.bitContainer = *(size_t *)local_188.ptr;
    if (local_188.bitContainer >> 0x38 == 0) {
      return 0xffffffffffffffec;
    }
    uVar29 = 0x1f;
    bVar1 = (byte)(local_188.bitContainer >> 0x38);
    if (bVar1 != 0) {
      for (; bVar1 >> uVar29 == 0; uVar29 = uVar29 - 1) {
      }
    }
    local_188.bitsConsumed = ~uVar29 + 9;
  }
  local_190 = local_1a0 + sVar9;
  local_188.start = (char *)puVar30;
  local_e8 = local_118[1];
  ZSTD_initFseState(&local_160,&local_188,local_f0->LLTptr);
  ZSTD_initFseState(&local_150,&local_188,pZVar12->OFTptr);
  ZSTD_initFseState(&local_140,&local_188,pZVar12->MLTptr);
  uVar32 = 0;
  if (local_188.bitsConsumed < 0x41) {
    uVar34 = 0;
    uVar32 = 0;
    if (0 < (int)uVar13) {
      uVar32 = (ulong)uVar13;
    }
    puVar30 = local_a8 + 1;
    do {
      uVar17 = local_130[1];
      if (local_188.ptr < local_188.limitPtr) {
        if (local_188.ptr != local_188.start) {
          uVar29 = (int)local_188.ptr - (int)local_188.start;
          if (local_188.start <=
              (ulong *)((long)local_188.ptr - (ulong)(local_188.bitsConsumed >> 3))) {
            uVar29 = local_188.bitsConsumed >> 3;
          }
          local_188.bitsConsumed = local_188.bitsConsumed + uVar29 * -8;
          goto LAB_0016375c;
        }
      }
      else {
        uVar29 = local_188.bitsConsumed >> 3;
        local_188.bitsConsumed = local_188.bitsConsumed & 7;
LAB_0016375c:
        local_188.ptr = (char *)((long)local_188.ptr - (ulong)uVar29);
        local_188.bitContainer = *(size_t *)local_188.ptr;
      }
      if (uVar32 == uVar34) goto LAB_00163aba;
      uVar7 = local_160.table[local_160.state].nextState;
      bVar1 = local_160.table[local_160.state].nbAdditionalBits;
      bVar2 = local_160.table[local_160.state].nbBits;
      uVar18 = (ulong)local_160.table[local_160.state].baseValue;
      uVar8 = local_140.table[local_140.state].nextState;
      bVar20 = local_140.table[local_140.state].nbAdditionalBits;
      bVar3 = local_140.table[local_140.state].nbBits;
      uVar31 = (ulong)local_140.table[local_140.state].baseValue;
      uVar6 = local_150.table[local_150.state].nextState;
      bVar4 = local_150.table[local_150.state].nbAdditionalBits;
      bVar5 = local_150.table[local_150.state].nbBits;
      bVar19 = (byte)local_188.bitsConsumed;
      if (bVar4 < 2) {
        if (bVar4 == 0) {
          if (uVar18 == 0) {
            local_130[1] = local_130[0];
            goto LAB_00163844;
          }
        }
        else {
          local_188.bitsConsumed = local_188.bitsConsumed + 1;
          lVar16 = (ulong)(local_150.table[local_150.state].baseValue + (uint)(uVar18 == 0)) -
                   ((long)(local_188.bitContainer << (bVar19 & 0x3f)) >> 0x3f);
          if (lVar16 == 3) {
            uVar17 = (local_130[0] - 1) + (ulong)(local_130[0] == 1);
LAB_00163a6c:
            local_130[2] = local_130[1];
          }
          else {
            uVar17 = local_130[lVar16] + (ulong)(local_130[lVar16] == 0);
            if (lVar16 != 1) goto LAB_00163a6c;
          }
          local_130[1] = local_130[0];
          local_130[0] = uVar17;
        }
      }
      else {
        if (0x1f < bVar4) goto LAB_0016470d;
        local_188.bitsConsumed = local_188.bitsConsumed + bVar4;
        local_130[1] = local_130[0];
        local_130[2] = uVar17;
        uVar17 = ((local_188.bitContainer << (bVar19 & 0x3f)) >> (-bVar4 & 0x3f)) +
                 (ulong)local_150.table[local_150.state].baseValue;
LAB_00163844:
        local_130[1] = local_130[0];
        local_130[0] = uVar17;
      }
      uVar17 = local_130[0];
      if (bVar20 != 0) {
        bVar19 = (byte)local_188.bitsConsumed;
        local_188.bitsConsumed = local_188.bitsConsumed + bVar20;
        uVar31 = uVar31 + ((local_188.bitContainer << (bVar19 & 0x3f)) >> (-bVar20 & 0x3f));
      }
      if (0x1e < (byte)(bVar20 + bVar1 + bVar4)) {
        BIT_reloadDStream(&local_188);
      }
      if (bVar1 != 0) {
        bVar20 = (byte)local_188.bitsConsumed;
        local_188.bitsConsumed = local_188.bitsConsumed + bVar1;
        uVar18 = uVar18 + ((local_188.bitContainer << (bVar20 & 0x3f)) >> (-bVar1 & 0x3f));
      }
      uVar21 = local_108 + uVar18;
      pBVar28 = local_118[uVar21 < uVar17];
      local_108 = uVar21 + uVar31;
      if (0x1f < bVar2) goto LAB_001646b0;
      iVar26 = bVar2 + local_188.bitsConsumed;
      local_160.state =
           (ulong)((uint)(local_188.bitContainer >> (-(char)iVar26 & 0x3fU)) & BIT_mask[(uint)bVar2]
                  ) + (ulong)uVar7;
      if (0x1f < bVar3) goto LAB_001646b0;
      iVar26 = iVar26 + (uint)bVar3;
      local_140.state =
           (ulong)((uint)(local_188.bitContainer >> (-(char)iVar26 & 0x3fU)) & BIT_mask[(uint)bVar3]
                  ) + (ulong)uVar8;
      if (0x1f < bVar5) goto LAB_001646b0;
      local_188.bitsConsumed = iVar26 + (uint)bVar5;
      local_150.state =
           (ulong)((uint)(local_188.bitContainer >> (-(char)local_188.bitsConsumed & 0x3fU)) &
                  BIT_mask[(uint)bVar5]) + (ulong)uVar6;
      puVar30[-3] = uVar18;
      puVar30[-2] = uVar31;
      puVar30[-1] = uVar17;
      *puVar30 = (ulong)(pBVar28 + (uVar21 - uVar17));
      uVar34 = uVar34 + 1;
      puVar30 = puVar30 + 4;
    } while (local_188.bitsConsumed < 0x41);
    uVar32 = uVar34 & 0xffffffff;
  }
  if ((int)uVar13 <= (int)uVar32) {
LAB_00163aba:
    pBVar22 = oend + -0x20;
    pBVar28 = local_f8;
    while (uVar34 = local_130[1], uVar29 = (uint)uVar32, local_188.bitsConsumed < 0x41) {
      if (local_188.ptr < local_188.limitPtr) {
        if (local_188.ptr != local_188.start) {
          uVar32 = (ulong)(uint)((int)local_188.ptr - (int)local_188.start);
          if (local_188.start <=
              (ulong *)((long)local_188.ptr - (ulong)(local_188.bitsConsumed >> 3))) {
            uVar32 = (ulong)(local_188.bitsConsumed >> 3);
          }
          local_188.bitsConsumed = local_188.bitsConsumed + (int)uVar32 * -8;
          goto LAB_00163b44;
        }
      }
      else {
        uVar32 = (ulong)(local_188.bitsConsumed >> 3);
        local_188.bitsConsumed = local_188.bitsConsumed & 7;
LAB_00163b44:
        local_188.ptr = (char *)((long)local_188.ptr - uVar32);
        local_188.bitContainer = *(size_t *)local_188.ptr;
      }
      if ((int)local_194 <= (int)uVar29) goto LAB_001642ba;
      uVar7 = local_160.table[local_160.state].nextState;
      bVar1 = local_160.table[local_160.state].nbAdditionalBits;
      bVar2 = local_160.table[local_160.state].nbBits;
      uVar32 = (ulong)local_160.table[local_160.state].baseValue;
      bVar20 = local_140.table[local_140.state].nbAdditionalBits;
      bVar3 = local_140.table[local_140.state].nbBits;
      local_1a8 = (ulong)local_140.table[local_140.state].baseValue;
      uVar8 = local_150.table[local_150.state].nextState;
      bVar4 = local_150.table[local_150.state].nbAdditionalBits;
      bVar5 = local_150.table[local_150.state].nbBits;
      bVar19 = (byte)local_188.bitsConsumed;
      if (bVar4 < 2) {
        if (bVar4 == 0) {
          if (uVar32 == 0) {
            local_130[1] = local_130[0];
            local_130[0] = uVar34;
          }
        }
        else {
          local_188.bitsConsumed = local_188.bitsConsumed + 1;
          lVar16 = (ulong)(local_150.table[local_150.state].baseValue + (uint)(uVar32 == 0)) -
                   ((long)(local_188.bitContainer << (bVar19 & 0x3f)) >> 0x3f);
          if (lVar16 == 3) {
            local_1c0 = (local_130[0] - 1) + (ulong)(local_130[0] == 1);
LAB_0016421b:
            local_130[2] = local_130[1];
          }
          else {
            local_1c0 = local_130[lVar16] + (ulong)(local_130[lVar16] == 0);
            if (lVar16 != 1) goto LAB_0016421b;
          }
          local_130[1] = local_130[0];
          local_130[0] = local_1c0;
        }
      }
      else {
        if (0x1f < bVar4) {
LAB_0016470d:
          __assert_fail("ofBits <= MaxOff",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x6407,
                        "seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e, const ZSTD_prefetch_e)"
                       );
        }
        local_188.bitsConsumed = local_188.bitsConsumed + bVar4;
        local_130[1] = local_130[0];
        local_130[2] = uVar34;
        local_130[0] = ((local_188.bitContainer << (bVar19 & 0x3f)) >> (-bVar4 & 0x3f)) +
                       (ulong)local_150.table[local_150.state].baseValue;
      }
      uVar34 = local_130[0];
      if (bVar20 != 0) {
        bVar19 = (byte)local_188.bitsConsumed;
        local_188.bitsConsumed = local_188.bitsConsumed + bVar20;
        local_1a8 = local_1a8 + ((local_188.bitContainer << (bVar19 & 0x3f)) >> (-bVar20 & 0x3f));
      }
      pBVar23 = (BYTE *)(ulong)local_140.table[local_140.state].nextState;
      if (0x1e < (byte)(bVar20 + bVar1 + bVar4)) {
        local_100 = (BYTE *)(ulong)local_140.table[local_140.state].nextState;
        BIT_reloadDStream(&local_188);
        pBVar23 = local_100;
      }
      if (bVar1 != 0) {
        bVar20 = (byte)local_188.bitsConsumed;
        local_188.bitsConsumed = local_188.bitsConsumed + bVar1;
        uVar32 = uVar32 + ((local_188.bitContainer << (bVar20 & 0x3f)) >> (-bVar1 & 0x3f));
      }
      uVar17 = local_108 + uVar32;
      pBVar36 = local_118[uVar17 < uVar34];
      local_108 = uVar17 + local_1a8;
      if (0x1f < bVar2) {
LAB_001646b0:
        __assert_fail("nbBits < BIT_MASK_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x65d,"size_t BIT_getMiddleBits(size_t, const U32, const U32)");
      }
      local_160.state =
           (ulong)((uint)(local_188.bitContainer >>
                         (-(char)(bVar2 + local_188.bitsConsumed) & 0x3fU)) & BIT_mask[bVar2]) +
           (ulong)uVar7;
      if (0x1f < bVar3) goto LAB_001646b0;
      iVar26 = bVar2 + local_188.bitsConsumed + (uint)bVar3;
      local_140.state =
           (size_t)(pBVar23 +
                   ((uint)(local_188.bitContainer >> (-(char)iVar26 & 0x3fU)) &
                   BIT_mask[(uint)bVar3]));
      if (0x1f < bVar5) goto LAB_001646b0;
      local_188.bitsConsumed = iVar26 + (uint)bVar5;
      local_150.state =
           (ulong)((uint)(local_188.bitContainer >> (-(char)local_188.bitsConsumed & 0x3fU)) &
                  BIT_mask[(uint)bVar5]) + (ulong)uVar8;
      uVar21 = (ulong)((uVar29 & 3) << 5);
      uVar31 = *(ulong *)((long)&local_b8 + uVar21);
      sVar27 = *(size_t *)((long)&local_b0 + uVar21);
      uVar18 = sVar27 + uVar31;
      if ((long)uVar18 <= (long)uVar31) goto LAB_001646cf;
      uVar10 = *(ulong *)((long)local_a8 + uVar21);
      pBVar33 = *(BYTE **)((long)local_a8 + uVar21 + 8);
      pBVar23 = local_1a0 + uVar31;
      if ((local_190 < pBVar23) || (pBVar37 = pBVar28 + uVar18, pBVar22 < pBVar37)) {
        sequence.matchLength = sVar27;
        sequence.litLength = uVar31;
        sequence.offset = uVar10;
        sequence.match = pBVar33;
        local_d8 = uVar31;
        sStack_d0 = sVar27;
        uStack_c8 = uVar10;
        pBStack_c0 = pBVar33;
        uVar18 = ZSTD_execSequenceEnd
                           (pBVar28,oend,sequence,&local_1a0,local_190,pBVar25,local_e0,local_e8);
      }
      else {
        pBVar33 = pBVar28 + uVar31;
        if (pBVar22 < pBVar33) goto LAB_001646ee;
        uVar11 = *(undefined8 *)(local_1a0 + 8);
        *(undefined8 *)pBVar28 = *(undefined8 *)local_1a0;
        *(undefined8 *)(pBVar28 + 8) = uVar11;
        if (0x10 < uVar31) {
          local_100 = pBVar37;
          ZSTD_decompressBlock_internal();
          pBVar37 = local_100;
        }
        pBVar35 = pBVar33 + -uVar10;
        local_1a0 = pBVar23;
        if ((ulong)((long)pBVar33 - (long)pBVar25) < uVar10) {
          if ((ulong)((long)pBVar33 - (long)local_e0) < uVar10) {
            return 0xffffffffffffffec;
          }
          lVar16 = (long)(pBVar33 + -uVar10) - (long)pBVar25;
          pBVar23 = local_e8 + lVar16;
          if (pBVar23 + sVar27 <= local_e8) {
            memmove(pBVar33,pBVar23,sVar27);
            goto LAB_00163f6a;
          }
          local_100 = pBVar37;
          memmove(pBVar33,pBVar23,-lVar16);
          pBVar33 = pBVar33 + -lVar16;
          sVar27 = sVar27 + lVar16;
          pBVar37 = local_100;
          pBVar35 = pBVar25;
        }
        if (pBVar37 < pBVar33) goto LAB_0016472c;
        if (pBVar35 < pBVar25) goto LAB_0016476a;
        if (sVar27 == 0) goto LAB_0016474b;
        if (uVar10 < 0x10) {
          if (pBVar33 < pBVar35) goto LAB_001647e6;
          if (uVar10 < 8) {
            iVar26 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                              ::dec64table + uVar10 * 4);
            *pBVar33 = *pBVar35;
            pBVar33[1] = pBVar35[1];
            pBVar33[2] = pBVar35[2];
            pBVar33[3] = pBVar35[3];
            pBVar23 = pBVar35 + *(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                          ::dec32table + uVar10 * 4);
            pBVar35 = pBVar35 + ((ulong)*(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar10 * 4) - (long)iVar26);
            *(undefined4 *)(pBVar33 + 4) = *(undefined4 *)pBVar23;
          }
          else {
            *(undefined8 *)pBVar33 = *(undefined8 *)pBVar35;
          }
          pBVar23 = pBVar35 + 8;
          pBVar24 = pBVar33 + 8;
          if ((long)pBVar24 - (long)pBVar23 < 8) goto LAB_00164805;
          if (8 < sVar27) {
            if (pBVar37 <= pBVar24) goto LAB_00164824;
            if ((ulong)((long)pBVar24 - (long)pBVar23) < 0x10) {
              do {
                *(undefined8 *)pBVar24 = *(undefined8 *)pBVar23;
                pBVar24 = pBVar24 + 8;
                pBVar23 = pBVar23 + 8;
              } while (pBVar24 < pBVar33 + sVar27);
            }
            else {
              uVar11 = *(undefined8 *)(pBVar35 + 0x10);
              *(undefined8 *)pBVar24 = *(undefined8 *)pBVar23;
              *(undefined8 *)(pBVar33 + 0x10) = uVar11;
              if (0x18 < (long)sVar27) {
                lVar16 = 0;
                do {
                  uVar11 = *(undefined8 *)(pBVar35 + lVar16 + 0x18 + 8);
                  pBVar23 = pBVar33 + lVar16 + 0x18;
                  *(undefined8 *)pBVar23 = *(undefined8 *)(pBVar35 + lVar16 + 0x18);
                  *(undefined8 *)(pBVar23 + 8) = uVar11;
                  uVar11 = *(undefined8 *)(pBVar35 + lVar16 + 0x28 + 8);
                  *(undefined8 *)(pBVar23 + 0x10) = *(undefined8 *)(pBVar35 + lVar16 + 0x28);
                  *(undefined8 *)(pBVar23 + 0x18) = uVar11;
                  lVar16 = lVar16 + 0x20;
                } while (pBVar23 + 0x20 < pBVar33 + sVar27);
              }
            }
          }
        }
        else {
          lVar16 = (long)pBVar33 - (long)pBVar35;
          if (lVar16 < 8) {
            if (-0x10 < lVar16) goto LAB_001647a8;
          }
          else if (0xffffffffffffffe0 < lVar16 - 0x10U) goto LAB_001647c7;
          uVar11 = *(undefined8 *)(pBVar35 + 8);
          *(undefined8 *)pBVar33 = *(undefined8 *)pBVar35;
          *(undefined8 *)(pBVar33 + 8) = uVar11;
          if (0x10 < (long)sVar27) {
            lVar16 = 0x10;
            do {
              uVar11 = *(undefined8 *)(pBVar35 + lVar16 + 8);
              pBVar23 = pBVar33 + lVar16;
              *(undefined8 *)pBVar23 = *(undefined8 *)(pBVar35 + lVar16);
              *(undefined8 *)(pBVar23 + 8) = uVar11;
              uVar11 = *(undefined8 *)(pBVar35 + lVar16 + 0x10 + 8);
              *(undefined8 *)(pBVar23 + 0x10) = *(undefined8 *)(pBVar35 + lVar16 + 0x10);
              *(undefined8 *)(pBVar23 + 0x18) = uVar11;
              lVar16 = lVar16 + 0x20;
            } while (pBVar23 + 0x20 < pBVar33 + sVar27);
          }
        }
      }
LAB_00163f6a:
      if (0xffffffffffffff88 < uVar18) {
        return uVar18;
      }
      *(ulong *)((long)&local_b8 + uVar21) = uVar32;
      *(ulong *)((long)&local_b0 + uVar21) = local_1a8;
      *(ulong *)((long)local_a8 + uVar21) = uVar34;
      *(BYTE **)((long)local_a8 + uVar21 + 8) = pBVar36 + (uVar17 - uVar34);
      pBVar28 = pBVar28 + uVar18;
      uVar32 = (ulong)(uVar29 + 1);
    }
    if ((int)local_194 <= (int)uVar29) {
LAB_001642ba:
      uVar29 = uVar29 - uVar13;
      if ((int)uVar29 < (int)local_194) {
        do {
          uVar17 = (ulong)((uVar29 & 3) << 5);
          uVar34 = *(ulong *)((long)&local_b8 + uVar17);
          sVar27 = *(size_t *)((long)&local_b0 + uVar17);
          uVar32 = sVar27 + uVar34;
          if ((long)uVar32 <= (long)uVar34) {
LAB_001646cf:
            __assert_fail("oLitEnd < oMatchEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x6386,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          uVar18 = *(ulong *)((long)local_a8 + uVar17);
          pBVar36 = *(BYTE **)((long)local_a8 + uVar17 + 8);
          pBVar23 = local_1a0 + uVar34;
          if ((local_190 < pBVar23) || (pBVar33 = pBVar28 + uVar32, pBVar22 < pBVar33)) {
            sequence_00.matchLength = sVar27;
            sequence_00.litLength = uVar34;
            sequence_00.offset = uVar18;
            sequence_00.match = pBVar36;
            local_d8 = uVar34;
            sStack_d0 = sVar27;
            uStack_c8 = uVar18;
            pBStack_c0 = pBVar36;
            uVar32 = ZSTD_execSequenceEnd
                               (pBVar28,oend,sequence_00,&local_1a0,local_190,pBVar25,local_e0,
                                local_e8);
          }
          else {
            pBVar36 = pBVar28 + uVar34;
            if (pBVar22 < pBVar36) {
LAB_001646ee:
              __assert_fail("oLitEnd <= oend_w",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x638c,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            uVar11 = *(undefined8 *)(local_1a0 + 8);
            *(undefined8 *)pBVar28 = *(undefined8 *)local_1a0;
            *(undefined8 *)(pBVar28 + 8) = uVar11;
            if (0x10 < uVar34) {
              ZSTD_decompressBlock_internal();
            }
            pBVar37 = pBVar36 + -uVar18;
            local_1a0 = pBVar23;
            if ((ulong)((long)pBVar36 - (long)pBVar25) < uVar18) {
              if ((ulong)((long)pBVar36 - (long)local_e0) < uVar18) {
                return 0xffffffffffffffec;
              }
              lVar16 = (long)(pBVar36 + -uVar18) - (long)pBVar25;
              pBVar23 = local_e8 + lVar16;
              if (pBVar23 + sVar27 <= local_e8) {
                memmove(pBVar36,pBVar23,sVar27);
                goto LAB_00164476;
              }
              memmove(pBVar36,pBVar23,-lVar16);
              pBVar36 = pBVar36 + -lVar16;
              sVar27 = sVar27 + lVar16;
              pBVar37 = pBVar25;
            }
            if (pBVar33 < pBVar36) {
LAB_0016472c:
              __assert_fail("op <= oMatchEnd",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x63ac,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            if (pBVar37 < pBVar25) {
LAB_0016476a:
              __assert_fail("match >= prefixStart",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x63ae,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            if (sVar27 == 0) {
LAB_0016474b:
              __assert_fail("sequence.matchLength >= 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x63af,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            if (uVar18 < 0x10) {
              if (pBVar36 < pBVar37) {
LAB_001647e6:
                __assert_fail("*ip <= *op",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x6301,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
              }
              if (uVar18 < 8) {
                iVar26 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                  ::dec64table + uVar18 * 4);
                *pBVar36 = *pBVar37;
                pBVar36[1] = pBVar37[1];
                pBVar36[2] = pBVar37[2];
                pBVar36[3] = pBVar37[3];
                pBVar23 = pBVar37 + *(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                              ::dec32table + uVar18 * 4);
                pBVar37 = pBVar37 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar18 * 4) - (long)iVar26);
                *(undefined4 *)(pBVar36 + 4) = *(undefined4 *)pBVar23;
              }
              else {
                *(undefined8 *)pBVar36 = *(undefined8 *)pBVar37;
              }
              pBVar23 = pBVar37 + 8;
              pBVar35 = pBVar36 + 8;
              if ((long)pBVar35 - (long)pBVar23 < 8) {
LAB_00164805:
                __assert_fail("*op - *ip >= 8",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x6313,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
              }
              if (8 < sVar27) {
                if (pBVar33 <= pBVar35) {
LAB_00164824:
                  __assert_fail("op < oMatchEnd",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x63c3,
                                "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                               );
                }
                if ((ulong)((long)pBVar35 - (long)pBVar23) < 0x10) {
                  do {
                    *(undefined8 *)pBVar35 = *(undefined8 *)pBVar23;
                    pBVar35 = pBVar35 + 8;
                    pBVar23 = pBVar23 + 8;
                  } while (pBVar35 < pBVar36 + sVar27);
                }
                else {
                  uVar11 = *(undefined8 *)(pBVar37 + 0x10);
                  *(undefined8 *)pBVar35 = *(undefined8 *)pBVar23;
                  *(undefined8 *)(pBVar36 + 0x10) = uVar11;
                  if (0x18 < (long)sVar27) {
                    lVar16 = 0;
                    do {
                      uVar11 = *(undefined8 *)(pBVar37 + lVar16 + 0x18 + 8);
                      pBVar23 = pBVar36 + lVar16 + 0x18;
                      *(undefined8 *)pBVar23 = *(undefined8 *)(pBVar37 + lVar16 + 0x18);
                      *(undefined8 *)(pBVar23 + 8) = uVar11;
                      uVar11 = *(undefined8 *)(pBVar37 + lVar16 + 0x28 + 8);
                      *(undefined8 *)(pBVar23 + 0x10) = *(undefined8 *)(pBVar37 + lVar16 + 0x28);
                      *(undefined8 *)(pBVar23 + 0x18) = uVar11;
                      lVar16 = lVar16 + 0x20;
                    } while (pBVar23 + 0x20 < pBVar36 + sVar27);
                  }
                }
              }
            }
            else {
              lVar16 = (long)pBVar36 - (long)pBVar37;
              if (lVar16 < 8) {
                if (-0x10 < lVar16) {
LAB_001647a8:
                  __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1268,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
              }
              else if (0xffffffffffffffe0 < lVar16 - 0x10U) {
LAB_001647c7:
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1270,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              uVar11 = *(undefined8 *)(pBVar37 + 8);
              *(undefined8 *)pBVar36 = *(undefined8 *)pBVar37;
              *(undefined8 *)(pBVar36 + 8) = uVar11;
              if (0x10 < (long)sVar27) {
                lVar16 = 0x10;
                do {
                  uVar11 = *(undefined8 *)(pBVar37 + lVar16 + 8);
                  pBVar23 = pBVar36 + lVar16;
                  *(undefined8 *)pBVar23 = *(undefined8 *)(pBVar37 + lVar16);
                  *(undefined8 *)(pBVar23 + 8) = uVar11;
                  uVar11 = *(undefined8 *)(pBVar37 + lVar16 + 0x10 + 8);
                  *(undefined8 *)(pBVar23 + 0x10) = *(undefined8 *)(pBVar37 + lVar16 + 0x10);
                  *(undefined8 *)(pBVar23 + 0x18) = uVar11;
                  lVar16 = lVar16 + 0x20;
                } while (pBVar23 + 0x20 < pBVar36 + sVar27);
              }
            }
          }
LAB_00164476:
          if (0xffffffffffffff88 < uVar32) {
            return uVar32;
          }
          pBVar28 = pBVar28 + uVar32;
          uVar29 = uVar29 + 1;
        } while (uVar29 != local_194);
      }
      lVar16 = 0;
      do {
        (local_f0->entropy).rep[lVar16] = (U32)local_130[lVar16];
        lVar16 = lVar16 + 1;
        pBVar25 = local_190;
        pBVar22 = local_f8;
      } while (lVar16 != 3);
      goto LAB_00164679;
    }
  }
  return 0xffffffffffffffec;
}

Assistant:

size_t
ZSTD_decompressBlock_internal(ZSTD_DCtx* dctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize, const int frame)
{   /* blockType == blockCompressed */
    const BYTE* ip = (const BYTE*)src;
    /* isLongOffset must be true if there are long offsets.
     * Offsets are long if they are larger than 2^STREAM_ACCUMULATOR_MIN.
     * We don't expect that to be the case in 64-bit mode.
     * In block mode, window size is not known, so we have to be conservative.
     * (note: but it could be evaluated from current-lowLimit)
     */
    ZSTD_longOffset_e const isLongOffset = (ZSTD_longOffset_e)(MEM_32bits() && (!frame || (dctx->fParams.windowSize > (1ULL << STREAM_ACCUMULATOR_MIN))));
    DEBUGLOG(5, "ZSTD_decompressBlock_internal (size : %u)", (U32)srcSize);

    RETURN_ERROR_IF(srcSize >= ZSTD_BLOCKSIZE_MAX, srcSize_wrong);

    /* Decode literals section */
    {   size_t const litCSize = ZSTD_decodeLiteralsBlock(dctx, src, srcSize);
        DEBUGLOG(5, "ZSTD_decodeLiteralsBlock : %u", (U32)litCSize);
        if (ZSTD_isError(litCSize)) return litCSize;
        ip += litCSize;
        srcSize -= litCSize;
    }

    /* Build Decoding Tables */
    {
        /* These macros control at build-time which decompressor implementation
         * we use. If neither is defined, we do some inspection and dispatch at
         * runtime.
         */
#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        int usePrefetchDecoder = dctx->ddictIsCold;
#endif
        int nbSeq;
        size_t const seqHSize = ZSTD_decodeSeqHeaders(dctx, &nbSeq, ip, srcSize);
        if (ZSTD_isError(seqHSize)) return seqHSize;
        ip += seqHSize;
        srcSize -= seqHSize;

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if ( !usePrefetchDecoder
          && (!frame || (dctx->fParams.windowSize > (1<<24)))
          && (nbSeq>ADVANCED_SEQS) ) {  /* could probably use a larger nbSeq limit */
            U32 const shareLongOffsets = ZSTD_getLongOffsetsShare(dctx->OFTptr);
            U32 const minShare = MEM_64bits() ? 7 : 20; /* heuristic values, correspond to 2.73% and 7.81% */
            usePrefetchDecoder = (shareLongOffsets >= minShare);
        }
#endif

        dctx->ddictIsCold = 0;

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if (usePrefetchDecoder)
#endif
#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT
            return ZSTD_decompressSequencesLong(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
#endif

#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG
        /* else */
        return ZSTD_decompressSequences(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
#endif
    }
}